

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpkeyhashtable.h
# Opt level: O0

int __thiscall
jrtplib::
RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
::GotoElement(RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
              *this,uint *k)

{
  bool bVar1;
  int iVar2;
  uint *puVar3;
  bool bVar4;
  bool found;
  int index;
  uint *k_local;
  RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPUDPv4Transmitter::PortInfo_*,_jrtplib::RTPUDPv4Trans_GetHashIndex_uint32_t,_8317>
  *this_local;
  
  iVar2 = RTPUDPv4Trans_GetHashIndex_uint32_t::GetIndex(k);
  if (iVar2 < 0x207d) {
    this->curhashelem = this->table[iVar2];
    bVar1 = false;
    while( true ) {
      bVar4 = false;
      if (!bVar1) {
        bVar4 = this->curhashelem != (HashElement *)0x0;
      }
      if (!bVar4) break;
      puVar3 = HashElement::GetKey(this->curhashelem);
      if (*puVar3 == *k) {
        bVar1 = true;
      }
      else {
        this->curhashelem = this->curhashelem->hashnext;
      }
    }
    if (bVar1) {
      this_local._4_4_ = 0;
    }
    else {
      this_local._4_4_ = -10;
    }
  }
  else {
    this_local._4_4_ = -8;
  }
  return this_local._4_4_;
}

Assistant:

inline int RTPKeyHashTable<Key,Element,GetIndex,hashsize>::GotoElement(const Key &k)
{
	int index;
	bool found;
	
	index = GetIndex::GetIndex(k);
	if (index >= hashsize)
		return ERR_RTP_KEYHASHTABLE_FUNCTIONRETURNEDINVALIDHASHINDEX;
	
	curhashelem = table[index]; 
	found = false;
	while(!found && curhashelem != 0)
	{
		if (curhashelem->GetKey() == k)
			found = true;
		else
			curhashelem = curhashelem->hashnext;
	}
	if (!found)
		return ERR_RTP_KEYHASHTABLE_KEYNOTFOUND;
	return 0;
}